

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCuesData.cpp
# Opt level: O2

void __thiscall
libmatroska::KaxCuePoint::PositionSet
          (KaxCuePoint *this,KaxBlockBlob *BlobReference,uint64 GlobalTimecodeScale)

{
  KaxInternalBlock *this_00;
  KaxCueTime *pKVar1;
  EbmlMaster *Master;
  KaxCueTrack *pKVar2;
  KaxCueClusterPosition *pKVar3;
  uint64 uVar4;
  KaxBlockGroup *this_01;
  EbmlElement *pEVar5;
  KaxCueCodecState *pKVar6;
  
  this_00 = KaxBlockBlob::operator_cast_to_KaxInternalBlock_(BlobReference);
  pKVar1 = libebml::GetChild<libmatroska::KaxCueTime>(&this->super_EbmlMaster);
  (pKVar1->super_EbmlUInteger).Value = this_00->Timecode / GlobalTimecodeScale;
  (pKVar1->super_EbmlUInteger).super_EbmlElement.bValueIsSet = true;
  Master = &libebml::AddNewChild<libmatroska::KaxCueTrackPositions>(&this->super_EbmlMaster)->
            super_EbmlMaster;
  pKVar2 = libebml::GetChild<libmatroska::KaxCueTrack>(Master);
  (pKVar2->super_EbmlUInteger).Value = (ulong)this_00->TrackNumber;
  (pKVar2->super_EbmlUInteger).super_EbmlElement.bValueIsSet = true;
  pKVar3 = libebml::GetChild<libmatroska::KaxCueClusterPosition>(Master);
  uVar4 = KaxInternalBlock::ClusterPosition(this_00);
  (pKVar3->super_EbmlUInteger).Value = uVar4;
  (pKVar3->super_EbmlUInteger).super_EbmlElement.bValueIsSet = true;
  if (BlobReference->bUseSimpleBlock == false) {
    this_01 = KaxBlockBlob::operator_cast_to_KaxBlockGroup_(BlobReference);
    pEVar5 = libebml::EbmlMaster::FindFirstElt
                       (&this_01->super_EbmlMaster,(EbmlCallbacks *)KaxCodecState::ClassInfos);
    if (pEVar5 != (EbmlElement *)0x0) {
      pKVar6 = libebml::AddNewChild<libmatroska::KaxCueCodecState>(Master);
      uVar4 = KaxSegment::GetRelativePosition
                        (this_01->ParentCluster->ParentSegment,pEVar5->ElementPosition);
      (pKVar6->super_EbmlUInteger).Value = uVar4;
      (pKVar6->super_EbmlUInteger).super_EbmlElement.bValueIsSet = true;
    }
  }
  (this->super_EbmlMaster).super_EbmlElement.bValueIsSet = true;
  return;
}

Assistant:

void KaxCuePoint::PositionSet(const KaxBlockBlob & BlobReference, uint64 GlobalTimecodeScale)
{
  const KaxInternalBlock &BlockReference = BlobReference;

  // fill me
  KaxCueTime & NewTime = GetChild<KaxCueTime>(*this);
  *static_cast<EbmlUInteger*>(&NewTime) = BlockReference.GlobalTimecode() / GlobalTimecodeScale;

  KaxCueTrackPositions & NewPositions = AddNewChild<KaxCueTrackPositions>(*this);
  KaxCueTrack & TheTrack = GetChild<KaxCueTrack>(NewPositions);
  *static_cast<EbmlUInteger*>(&TheTrack) = BlockReference.TrackNum();

  KaxCueClusterPosition & TheClustPos = GetChild<KaxCueClusterPosition>(NewPositions);
  *static_cast<EbmlUInteger*>(&TheClustPos) = BlockReference.ClusterPosition();

#if 0 // MATROSKA_VERSION >= 2
  // handle reference use
  if (BlockReference.ReferenceCount() != 0) {
    unsigned int i;
    for (i=0; i<BlockReference.ReferenceCount(); i++) {
      KaxCueReference & NewRefs = AddNewChild<KaxCueReference>(NewPositions);
      NewRefs.AddReference(BlockReference.Reference(i).RefBlock(), GlobalTimecodeScale);
    }
  }
#endif // MATROSKA_VERSION

#if MATROSKA_VERSION >= 2
  if (!BlobReference.IsSimpleBlock()) {
    const KaxBlockGroup &BlockGroup = BlobReference;
    const KaxCodecState *CodecState = static_cast<KaxCodecState *>(BlockGroup.FindFirstElt(EBML_INFO(KaxCodecState)));
    if (CodecState != NULL) {
      KaxCueCodecState &CueCodecState = AddNewChild<KaxCueCodecState>(NewPositions);
      *static_cast<EbmlUInteger*>(&CueCodecState) = BlockGroup.GetParentCluster()->GetParentSegment()->GetRelativePosition(CodecState->GetElementPosition());
    }
  }
#endif // MATROSKA_VERSION

  SetValueIsSet();
}